

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall Transaction_CommitInt_Test::TestBody(Transaction_CommitInt_Test *this)

{
  element_type *peVar1;
  long lVar2;
  element_type *peVar3;
  char cVar4;
  uint64_t uVar5;
  pointer *__ptr;
  char *message;
  _func_int **pp_Var6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c8;
  AssertHelper local_1c0;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  uint64_t g1footer_offset;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  int data_value;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> rw;
  database db;
  
  pstore::database::database<pstore::file::in_memory>
            (&db,&(this->super_Transaction).store_.file_,true);
  db.vacuum_mode_ = disabled;
  peVar1 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)(peVar1 + 0x28);
  data_value = 0x7fed;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&rw,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&transaction,&db,(lock_type *)&rw)
  ;
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&rw);
  pstore::transaction_base::alloc_rw<int,void>(&rw,&transaction.super_transaction_base,1);
  local_1c0.data_._0_4_ = 0;
  local_1c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)((uint)rw.second.a_.a_ & 3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&g1footer_offset,"0U","rw.second.absolute () % alignof (int)",
             (uint *)&local_1c0,(unsigned_long *)&local_1c8);
  cVar4 = (char)g1footer_offset;
  if ((char)g1footer_offset == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                    "The address must be suitably aligned for int");
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_170._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = *(char **)local_170._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x8e,message);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rw.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_170);
    *rw.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x7fed;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rw.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pstore::transaction_base::commit(&transaction.super_transaction_base);
  }
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  if (cVar4 != '\0') {
    rw.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0xb8;
    g1footer_offset = *(uint64_t *)(peVar1 + 0x28);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&transaction,"new_header_offset","g1footer_offset",(unsigned_long *)&rw,
               &g1footer_offset);
    if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
      testing::Message::Message((Message *)&local_1c8);
      std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                      "Expected offset of r1 footer to be ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_1c8._M_head_impl + 0x10));
      if (transaction.super_transaction_base.db_ == (database *)0x0) {
        pp_Var6 = (_func_int **)0x1ec539;
      }
      else {
        pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0x9e,(char *)pp_Var6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl._0_4_ = *(undefined4 *)peVar1;
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,4ul>>>>
      ::operator()(&transaction,(char *)&local_1c8,
                   (array<unsigned_char,_4UL> *)"pstore::header::file_signature1");
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),"File header was missing");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xa3,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (peVar1 + 0x28);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&transaction,"g1footer_offset","header->footer_pos.load ().absolute ()"
                 ,&g1footer_offset,(unsigned_long *)&local_1c8);
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xa5,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      peVar1 = (this->super_Transaction).store_.buffer_.
               super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (peVar1 + lVar2);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(&transaction,(char *)&local_1c8,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "Did not find the r0 footer signature1");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xac,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl = local_1c8._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
                ((internal *)&transaction,"0U","r0footer->a.generation",(uint *)&local_1c8,
                 (atomic<unsigned_int> *)(peVar1 + lVar2 + 8));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "r0 footer generation number must be 0");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xae,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl = local_1c8._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
                ((internal *)&transaction,"0U","r0footer->a.size",(uint *)&local_1c8,
                 (atomic<unsigned_long> *)(peVar1 + lVar2 + 0x10));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "expected the r0 footer size value to be 0");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xaf,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
                ((internal *)&transaction,"pstore::typed_address<pstore::trailer>::null ()",
                 "r0footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_1c8,
                 (typed_address<pstore::trailer> *)(peVar1 + lVar2 + 0x20));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "The r0 footer should not point to a previous generation");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb0,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (peVar1 + lVar2 + 0x68);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(&transaction,(char *)&local_1c8,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "Did not find r0 footer signature2");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb3,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      uVar5 = g1footer_offset;
      peVar3 = (this->super_Transaction).store_.buffer_.
               super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (peVar3 + g1footer_offset);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(&transaction,(char *)&local_1c8,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "Did not find the r1 footer signature1");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb9,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
                ((internal *)&transaction,"1U","r1footer->a.generation",(uint *)&local_1c8,
                 (atomic<unsigned_int> *)(peVar3 + uVar5 + 8));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "r1 footer generation number must be 1");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbb,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
      testing::internal::CmpHelperGE<std::atomic<unsigned_long>,unsigned_long>
                ((internal *)&transaction,"r1footer->a.size","sizeof (int)",
                 (atomic<unsigned_long> *)(peVar3 + uVar5 + 0x10),(unsigned_long *)&local_1c8);
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "r1 footer size must be at least sizeof (int");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbc,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40;
      testing::internal::
      CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
                ((internal *)&transaction,
                 "pstore::typed_address<pstore::trailer>::make (pstore::leader_size)",
                 "r1footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_1c8,
                 (typed_address<pstore::trailer> *)(peVar3 + uVar5 + 0x20));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "r1 previous pointer must point to r0 footer");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbe,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      local_1c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (peVar3 + uVar5 + 0x68);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(&transaction,(char *)&local_1c8,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "Did not find r1 footer signature2");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xc1,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
                ((internal *)&transaction,"r1footer->a.time","r0footer->a.time",
                 (atomic<unsigned_long> *)(peVar3 + uVar5 + 0x18),
                 (atomic<unsigned_long> *)(peVar1 + lVar2 + 0x18));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        std::operator<<((ostream *)(local_1c8._M_head_impl + 0x10),
                        "r1 time must not be earlier than r0 time");
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xc4,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&transaction,"data_value","*r1data",&data_value,
                 (int *)((this->super_Transaction).store_.buffer_.
                         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xb0
                        ));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&local_1c8);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var6 = (_func_int **)0x1ec539;
        }
        else {
          pp_Var6 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xcb,(char *)pp_Var6);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if (local_1c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
        }
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&transaction.super_transaction_base.db_);
  }
  pstore::database::~database(&db);
  return;
}

Assistant:

TEST_F (Transaction, CommitInt) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto header = this->get_header ();
    std::uint64_t const r0footer_offset = header->footer_pos.load ().absolute ();

    int const data_value = 32749;

    // Scope for the single transaction that we'll commit for the test.
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        {
            // Write an integer to the store.
            // If rw is a spanning pointer, it will only be saved to the store when it is deleted.
            // TODO: write a large vector (>4K) so the 'protect' function, which is called by the
            // transaction commit function, has an effect.
            std::pair<std::shared_ptr<int>, pstore::typed_address<int>> rw =
                transaction.alloc_rw<int> ();
            ASSERT_EQ (0U, rw.second.absolute () % alignof (int))
                << "The address must be suitably aligned for int";
            *(rw.first) = data_value;
        }

        transaction.commit ();
    }

    std::uint64_t new_header_offset = pstore::leader_size;
    new_header_offset += sizeof (pstore::trailer);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (int));
    std::uint64_t const r1contents_offset = new_header_offset;
    new_header_offset += sizeof (int);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (pstore::trailer));

    std::uint64_t const g1footer_offset = header->footer_pos.load ().absolute ();
    ASSERT_EQ (new_header_offset, g1footer_offset)
        << "Expected offset of r1 footer to be " << new_header_offset;


    // Header checks.
    EXPECT_THAT (pstore::header::file_signature1, ::testing::ContainerEq (header->a.signature1))
        << "File header was missing";
    EXPECT_EQ (g1footer_offset, header->footer_pos.load ().absolute ());

    // Check the two footers.
    {
        auto r0footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + r0footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0footer->a.signature1))
            << "Did not find the r0 footer signature1";
        EXPECT_EQ (0U, r0footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0footer->signature2))
            << "Did not find r0 footer signature2";

        auto r1footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + g1footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1footer->a.signature1))
            << "Did not find the r1 footer signature1";
        EXPECT_EQ (1U, r1footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_GE (r1footer->a.size, sizeof (int)) << "r1 footer size must be at least sizeof (int";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (pstore::leader_size),
                   r1footer->a.prev_generation)
            << "r1 previous pointer must point to r0 footer";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1footer->signature2))
            << "Did not find r1 footer signature2";

        EXPECT_GE (r1footer->a.time, r0footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }

    // Finally check the r1 contents
    {
        auto r1data = reinterpret_cast<int const *> (store_.buffer ().get () + r1contents_offset);
        EXPECT_EQ (data_value, *r1data);
    }
}